

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O3

float quad_decode(apriltag_detector_t *td,apriltag_family_t *family,image_u8_t *im,quad *quad,
                 quick_decode_entry *entry,image_u8_t *im_samples)

{
  undefined8 uVar1;
  undefined8 uVar2;
  byte bVar3;
  uint32_t uVar4;
  matd_t *pmVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint64_t uVar9;
  undefined1 auVar10 [16];
  apriltag_detector_t *paVar11;
  int pattern_idx;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint64_t *puVar20;
  double *pdVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar31;
  float fVar32;
  int iVar33;
  int iVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  double dStack_290;
  graymodel local_288;
  graymodel local_208;
  undefined8 local_188 [2];
  float local_178 [36];
  quick_decode_entry *local_e8;
  undefined1 *local_e0;
  double local_d8;
  double dStack_d0;
  image_u8_t *local_c0;
  double *local_b8;
  apriltag_detector_t *local_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  double local_68;
  double dStack_60;
  undefined1 local_58 [20];
  int local_44;
  double local_40;
  double local_38;
  
  local_c0 = im_samples;
  local_e8 = entry;
  local_188[0] = 0x3f000000bf000000;
  local_188[1] = 0x3f80000000000000;
  local_178[0] = 1.0;
  local_178[1] = 0.5;
  local_178[2] = 0.5;
  local_178[3] = 0.0;
  local_178[4] = 1.0;
  local_178[5] = 0.0;
  iVar18 = family->width_at_border;
  local_178[6] = (float)iVar18 + 0.5;
  local_b0 = td;
  local_178[7] = 0.5;
  local_178[8] = 0.0;
  local_178[9] = 1.0;
  local_178[10] = 1.0;
  local_178[0xb] = (float)iVar18 + -0.5;
  local_178[0xc] = 0.5;
  local_178[0xd] = 0.0;
  local_178[0xe] = 1.0;
  local_178[0xf] = 0.0;
  local_178[0x10] = 0.5;
  local_178[0x11] = -0.5;
  local_178[0x12] = 1.0;
  local_178[0x13] = 0.0;
  local_178[0x14] = 1.0;
  local_178[0x15] = 0.5;
  local_178[0x16] = 0.5;
  local_178[0x17] = 1.0;
  local_178[0x18] = 0.0;
  local_178[0x19] = 0.0;
  local_178[0x1a] = 0.5;
  local_178[0x1b] = local_178[6];
  local_178[0x1c] = 1.0;
  local_178[0x1d] = 0.0;
  local_178[0x1e] = 1.0;
  local_178[0x1f] = 0.5;
  local_178[0x20] = local_178[0xb];
  local_178[0x21] = 1.0;
  local_178[0x22] = 0.0;
  local_178[0x23] = 0.0;
  local_288.A[0][0] = 0.0;
  local_288.A[0][1] = 0.0;
  local_288.A[1][0] = 0.0;
  local_288.A[1][1] = 0.0;
  local_288.A[1][2] = 0.0;
  local_288.A[2][0] = 0.0;
  local_288.A[2][1] = 0.0;
  local_288.A[2][2] = 0.0;
  local_288.B[0] = 0.0;
  local_288.B[1] = 0.0;
  local_288.B[2] = 0.0;
  local_288.C[0] = 0.0;
  local_288.C[1] = 0.0;
  local_288.C[2] = 0.0;
  local_208.A[1][0] = 0.0;
  local_208.A[1][1] = 0.0;
  local_208.A[1][2] = 0.0;
  local_208.A[2][0] = 0.0;
  local_208.A[2][1] = 0.0;
  local_208.A[2][2] = 0.0;
  local_208.B[0] = 0.0;
  local_208.B[1] = 0.0;
  local_208.B[2] = 0.0;
  local_208.C[0] = 0.0;
  local_208.C[1] = 0.0;
  local_208.C[2] = 0.0;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_88._0_8_;
  local_88 = auVar27 << 0x40;
  lVar12 = 0;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_78._0_8_;
  local_78 = auVar10 << 0x40;
  local_40 = 0.0;
  local_a8 = 0.0;
  local_38 = 0.0;
  local_98 = 0.0;
  local_288.A[2][2] = 0.0;
  local_288.A[1][2] = 0.0;
  local_288.A[1][1] = 0.0;
  local_288.A[0][2] = 0.0;
  local_288.B[0] = 0.0;
  local_288.B[1] = 0.0;
  local_68 = 0.0;
  dStack_60 = 0.0;
  local_58._0_16_ = ZEXT816(0);
  do {
    if (0 < iVar18) {
      fVar32 = local_178[lVar12 * 5];
      uVar1 = *(undefined8 *)((long)local_188 + lVar12 * 0x14);
      uVar2 = *(undefined8 *)((long)local_188 + lVar12 * 0x14 + 8);
      iVar17 = 0;
      do {
        fVar23 = (float)iVar17;
        fVar31 = (float)iVar18;
        auVar26._0_4_ = fVar23 * (float)uVar2 + (float)uVar1;
        auVar26._4_4_ = fVar23 * (float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20);
        auVar26._8_4_ = fVar23 * 0.0 + 0.0;
        auVar26._12_4_ = fVar23 * 0.0 + 0.0;
        auVar7._4_4_ = fVar31;
        auVar7._0_4_ = fVar31;
        auVar7._8_4_ = fVar31;
        auVar7._12_4_ = fVar31;
        auVar27 = divps(auVar26,auVar7);
        dVar25 = (double)auVar27._0_4_ + -0.5;
        dVar30 = (double)auVar27._4_4_ + -0.5;
        dVar25 = dVar25 + dVar25;
        dVar30 = dVar30 + dVar30;
        pmVar5 = quad->H;
        uVar19 = pmVar5->ncols;
        dVar37 = (double)pmVar5[(ulong)(uVar19 * 2 + 2) + 1] +
                 (double)pmVar5[(ulong)(uVar19 * 2) + 1] * dVar25 +
                 (double)pmVar5[(ulong)(uVar19 * 2) + 2] * dVar30;
        auVar35._8_8_ = (double)pmVar5[1] * dVar25 + (double)pmVar5[2] * dVar30 + (double)pmVar5[3];
        auVar35._0_8_ =
             (double)pmVar5[(ulong)(uVar19 + 2) + 1] +
             (double)pmVar5[(ulong)uVar19 + 1] * dVar25 +
             (double)pmVar5[(ulong)(uVar19 + 1) + 1] * dVar30;
        auVar8._8_8_ = dVar37;
        auVar8._0_8_ = dVar37;
        auVar27 = divpd(auVar35,auVar8);
        iVar33 = (int)auVar27._0_8_;
        iVar34 = (int)auVar27._8_8_;
        auVar36._4_4_ = iVar33;
        auVar36._0_4_ = iVar33;
        auVar36._8_4_ = iVar34;
        auVar36._12_4_ = iVar34;
        iVar18 = movmskpd((int)pmVar5,auVar36);
        if (((iVar18 == 0) && (iVar34 < im->width)) && (iVar33 < im->height)) {
          bVar3 = im->buf[im->stride * iVar33 + iVar34];
          if (im_samples != (image_u8_t *)0x0) {
            im_samples->buf[iVar33 * im_samples->stride + iVar34] = (char)(int)fVar32 + 0xff;
          }
          dVar37 = (double)bVar3;
          if ((int)fVar32 == 0) {
            local_68 = local_68 + dVar25 * dVar25;
            dStack_60 = dStack_60 + dVar25 * dVar30;
            local_38 = local_38 + dVar25;
            local_a8 = local_a8 + dVar30 * dVar30;
            local_40 = local_40 + dVar30;
            local_78._0_8_ = (double)local_78._0_8_ + 1.0;
            local_88._0_8_ = (double)local_88._0_8_ + dVar37;
            dVar30 = (double)local_58._8_8_ + dVar30 * dVar37;
            local_58._8_4_ = SUB84(dVar30,0);
            local_58._0_8_ = (double)local_58._0_8_ + dVar25 * dVar37;
            local_58._12_4_ = (int)((ulong)dVar30 >> 0x20);
          }
          else {
            local_288.A[0][0] = local_288.A[0][0] + dVar25 * dVar25;
            local_288.A[0][1] = local_288.A[0][1] + dVar25 * dVar30;
            local_288.A[0][2] = local_288.A[0][2] + dVar25;
            local_288.A[1][1] = local_288.A[1][1] + dVar30 * dVar30;
            local_288.A[1][2] = local_288.A[1][2] + dVar30;
            local_288.A[2][2] = local_288.A[2][2] + 1.0;
            local_98 = local_98 + dVar37;
            local_288.B[0] = local_288.B[0] + dVar25 * dVar37;
            local_288.B[1] = local_288.B[1] + dVar30 * dVar37;
          }
        }
        iVar17 = iVar17 + 1;
        iVar18 = family->width_at_border;
      } while (iVar17 < iVar18);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 8);
  local_288.B[2] = local_98;
  local_208.A[0][2] = local_38;
  local_208.A[1][1] = local_a8;
  local_208.A[1][2] = local_40;
  local_208.A[2][2] = (double)local_78._0_8_;
  local_208.B[0] = (double)local_58._0_8_;
  local_208.B[1] = (double)local_58._8_8_;
  local_208.B[2] = (double)local_88._0_8_;
  local_208.A[0][0] = local_68;
  local_208.A[0][1] = dStack_60;
  dStack_290 = 5.37260817125855e-318;
  graymodel_solve(&local_288);
  dStack_290 = 5.37264769651022e-318;
  graymodel_solve(&local_208);
  local_58._8_8_ = 0;
  local_58._0_8_ = local_208.C[1];
  local_68 = local_208.C[0];
  dStack_60 = 0.0;
  local_d8 = local_208.C[2];
  dStack_d0 = 0.0;
  if (family->reversed_border ==
      local_288.C[2] + local_288.C[0] * 0.0 + local_288.C[1] * 0.0 <
      local_208.C[2] + local_208.C[0] * 0.0 + local_208.C[1] * 0.0) {
    local_78._8_8_ = 0;
    local_78._0_8_ = local_288.C[2];
    local_88._8_8_ = 0;
    local_88._0_8_ = local_288.C[0];
    local_98 = local_288.C[1];
    uStack_90 = 0;
    lVar12 = -((ulong)(uint)(family->total_width * family->total_width) * 8 + 0xf & 0x7fffffff0);
    pdVar21 = (double *)((long)&local_288 + lVar12);
    iVar18 = family->total_width;
    local_e0 = (undefined1 *)&local_288;
    *(undefined8 *)((long)&dStack_290 + lVar12) = 0x109899;
    memset(pdVar21,0,(ulong)(uint)(iVar18 * iVar18) << 3);
    paVar11 = local_b0;
    uVar4 = family->nbits;
    local_38._0_4_ = uVar4;
    if (uVar4 == 0) {
      *(undefined8 *)((long)&dStack_290 + lVar12) = 0x109b95;
      sharpen(paVar11,pdVar21,iVar18);
      fVar31 = 0.0;
      fVar23 = 1.0;
      uVar13 = 0;
      fVar32 = 1.0;
      fVar24 = 0.0;
      uVar16 = 0;
      local_38._0_4_ = 0;
    }
    else {
      local_44 = (family->width_at_border - iVar18) / 2;
      dStack_d0 = (double)local_78._0_8_;
      dStack_60 = (double)local_88._0_8_;
      local_58._8_8_ = local_98;
      uVar16 = 0;
      local_b8 = pdVar21;
      do {
        uVar4 = family->bit_y[uVar16];
        local_98 = (double)CONCAT44(local_98._4_4_,family->bit_x[uVar16]);
        dVar25 = ((double)(int)family->bit_x[uVar16] + 0.5) / (double)family->width_at_border + -0.5
        ;
        dVar25 = dVar25 + dVar25;
        dVar30 = ((double)(int)uVar4 + 0.5) / (double)family->width_at_border + -0.5;
        dVar30 = dVar30 + dVar30;
        pmVar5 = quad->H;
        uVar19 = pmVar5->ncols;
        local_78._8_4_ = SUB84(dVar30,0);
        local_78._0_8_ = dVar30;
        local_78._12_4_ = (int)((ulong)dVar30 >> 0x20);
        local_88._8_4_ = SUB84(dVar25,0);
        local_88._0_8_ = dVar25;
        local_88._12_4_ = (int)((ulong)dVar25 >> 0x20);
        dStack_a0 = (double)pmVar5[(ulong)(uVar19 * 2 + 2) + 1] +
                    (double)pmVar5[(ulong)(uVar19 * 2) + 1] * dVar25 +
                    (double)pmVar5[(ulong)(uVar19 * 2) + 2] * dVar30;
        dVar37 = ((double)pmVar5[3] + (double)pmVar5[1] * dVar25 + (double)pmVar5[2] * dVar30) /
                 dStack_a0;
        dVar25 = ((double)pmVar5[(ulong)uVar19 + 1] * dVar25 +
                  (double)pmVar5[(ulong)(uVar19 + 1) + 1] * dVar30 +
                 (double)pmVar5[(ulong)(uVar19 + 2) + 1]) / dStack_a0;
        local_a8 = dVar37;
        local_40 = dVar25;
        *(undefined8 *)((long)&dStack_290 + lVar12) = 0x1099ed;
        dVar25 = value_for_pixel(im,dVar37,dVar25);
        paVar11 = local_b0;
        pdVar21 = local_b8;
        if ((dVar25 != -1.0) || (NAN(dVar25))) {
          dVar30 = ((double)local_88._8_8_ * dStack_60 +
                    (double)local_78._8_8_ * (double)local_58._8_8_ + dStack_d0 +
                   (double)local_88._0_8_ * local_68 +
                   (double)local_78._0_8_ * (double)local_58._0_8_ + local_d8) * 0.5;
          local_b8[(int)((local_98._0_4_ - local_44) + (uVar4 - local_44) * family->total_width)] =
               dVar25 - dVar30;
          if (local_c0 != (image_u8_t *)0x0) {
            local_c0->buf[(int)local_40 * local_c0->stride + (int)local_a8] = -(dVar25 < dVar30);
            local_38._0_4_ = family->nbits;
          }
        }
        uVar16 = uVar16 + 1;
        uVar13 = (ulong)local_38._0_4_;
      } while (uVar16 < uVar13);
      iVar18 = family->total_width;
      *(undefined8 *)((long)&dStack_290 + lVar12) = 0x109adf;
      sharpen(paVar11,pdVar21,iVar18);
      if (local_38._0_4_ == 0) {
        fVar31 = 0.0;
        fVar23 = 1.0;
        local_38._0_4_ = 0;
        uVar13 = 0;
        fVar32 = 1.0;
        fVar24 = 0.0;
        uVar16 = 0;
      }
      else {
        auVar29 = ZEXT816(0);
        uVar15 = 0;
        uVar16 = 0;
        fVar31 = 0.0;
        fVar32 = 1.0;
        fVar23 = 1.0;
        do {
          uVar16 = uVar16 * 2;
          dVar25 = pdVar21[(int)((family->bit_x[uVar15] - local_44) +
                                (family->bit_y[uVar15] - local_44) * iVar18)];
          if (dVar25 <= 0.0) {
            auVar28._8_8_ = auVar29._8_8_;
            auVar28._0_8_ = (double)auVar29._0_4_ - dVar25;
            auVar29._4_12_ = auVar28._4_12_;
            auVar29._0_4_ = (float)auVar28._0_8_;
            fVar32 = fVar32 + 1.0;
          }
          else {
            fVar31 = (float)(dVar25 + (double)fVar31);
            fVar23 = fVar23 + 1.0;
            uVar16 = uVar16 | 1;
          }
          fVar24 = auVar29._0_4_;
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
    }
    iVar18 = *family->impl;
    lVar12 = *(long *)((long)family->impl + 8);
    bVar22 = (local_38._0_4_ & 0x80000003) == 1;
    uVar19 = (uint)bVar22;
    iVar33 = local_38._0_4_ - uVar19;
    iVar17 = (local_38._0_4_ - uVar19) + 3;
    if (-1 < iVar33) {
      iVar17 = iVar33;
    }
    iVar34 = iVar33 * 3 + 3;
    if (-1 < iVar33 * 3) {
      iVar34 = iVar33 * 3;
    }
    iVar33 = 0;
    do {
      uVar15 = uVar16 % (ulong)(long)iVar18;
      while( true ) {
        lVar14 = (long)(int)uVar15 * 0x10;
        uVar6 = *(ulong *)(lVar12 + lVar14);
        if (uVar6 == 0xffffffffffffffff) break;
        if (uVar6 == uVar16) {
          puVar20 = (uint64_t *)(lVar12 + lVar14);
          uVar9 = puVar20[1];
          local_e8->rcode = *puVar20;
          local_e8->id = (short)uVar9;
          local_e8->hamming = (char)(uVar9 >> 0x10);
          local_e8->rotation = (char)(uVar9 >> 0x18);
          *(int *)&local_e8->field_0xc = (int)(uVar9 >> 0x20);
          goto LAB_00109ca9;
        }
        uVar15 = (long)((int)uVar15 + 1) % (long)iVar18 & 0xffffffff;
      }
      uVar16 = ((ulong)((uint)uVar16 & uVar19) |
                (uVar16 >> bVar22) << ((char)(iVar17 >> 2) + bVar22 & 0x3fU) |
               (uVar16 >> ((char)(iVar34 >> 2) + bVar22 & 0x3fU)) << bVar22) &
               ~(-1L << ((byte)uVar13 & 0x3f));
      iVar33 = iVar33 + 1;
    } while (iVar33 != 4);
    local_e8->rcode = 0;
    local_e8->id = 0xffff;
    local_e8->hamming = 0xff;
    iVar33 = 0;
LAB_00109ca9:
    local_e8->rotation = (uint8_t)iVar33;
    fVar31 = fVar31 / fVar23;
    fVar24 = fVar24 / fVar32;
    fVar32 = fVar24;
    if (fVar31 <= fVar24) {
      fVar32 = fVar31;
    }
    fVar32 = (float)(~-(uint)NAN(fVar31) & (uint)fVar32 | -(uint)NAN(fVar31) & (uint)fVar24);
  }
  else {
    fVar32 = -1.0;
  }
  return fVar32;
}

Assistant:

float quad_decode(apriltag_detector_t* td, apriltag_family_t *family, image_u8_t *im, struct quad *quad, struct quick_decode_entry *entry, image_u8_t *im_samples)
{
    // decode the tag binary contents by sampling the pixel
    // closest to the center of each bit cell.

    // We will compute a threshold by sampling known white/black cells around this tag.
    // This sampling is achieved by considering a set of samples along lines.
    //
    // coordinates are given in bit coordinates. ([0, fam->border_width]).
    //
    // { initial x, initial y, delta x, delta y, WHITE=1 }
    float patterns[] = {
        // left white column
        -0.5, 0.5,
        0, 1,
        1,

        // left black column
        0.5, 0.5,
        0, 1,
        0,

        // right white column
        family->width_at_border + 0.5, .5,
        0, 1,
        1,

        // right black column
        family->width_at_border - 0.5, .5,
        0, 1,
        0,

        // top white row
        0.5, -0.5,
        1, 0,
        1,

        // top black row
        0.5, 0.5,
        1, 0,
        0,

        // bottom white row
        0.5, family->width_at_border + 0.5,
        1, 0,
        1,

        // bottom black row
        0.5, family->width_at_border - 0.5,
        1, 0,
        0

        // XXX double-counts the corners.
    };

    struct graymodel whitemodel, blackmodel;
    graymodel_init(&whitemodel);
    graymodel_init(&blackmodel);

    for (int pattern_idx = 0; pattern_idx < sizeof(patterns)/(5*sizeof(float)); pattern_idx ++) {
        float *pattern = &patterns[pattern_idx * 5];

        int is_white = pattern[4];

        for (int i = 0; i < family->width_at_border; i++) {
            double tagx01 = (pattern[0] + i*pattern[2]) / (family->width_at_border);
            double tagy01 = (pattern[1] + i*pattern[3]) / (family->width_at_border);

            double tagx = 2*(tagx01-0.5);
            double tagy = 2*(tagy01-0.5);

            double px, py;
            homography_project(quad->H, tagx, tagy, &px, &py);

            // don't round
            int ix = px;
            int iy = py;
            if (ix < 0 || iy < 0 || ix >= im->width || iy >= im->height)
                continue;

            int v = im->buf[iy*im->stride + ix];

            if (im_samples) {
                im_samples->buf[iy*im_samples->stride + ix] = (1-is_white)*255;
            }

            if (is_white)
                graymodel_add(&whitemodel, tagx, tagy, v);
            else
                graymodel_add(&blackmodel, tagx, tagy, v);
        }
    }

    graymodel_solve(&whitemodel);
    graymodel_solve(&blackmodel);

    // XXX Tunable
    if ((graymodel_interpolate(&whitemodel, 0, 0) - graymodel_interpolate(&blackmodel, 0, 0) < 0) != family->reversed_border) {
        return -1;
    }

    // compute the average decision margin (how far was each bit from
    // the decision boundary?
    //
    // we score this separately for white and black pixels and return
    // the minimum average threshold for black/white pixels. This is
    // to penalize thresholds that are too close to an extreme.
    float black_score = 0, white_score = 0;
    float black_score_count = 1, white_score_count = 1;

    double values[family->total_width*family->total_width];
    memset(values, 0, family->total_width*family->total_width*sizeof(double));

    int min_coord = (family->width_at_border - family->total_width)/2;
    for (int i = 0; i < family->nbits; i++) {
        int bity = family->bit_y[i];
        int bitx = family->bit_x[i];

        double tagx01 = (bitx + 0.5) / (family->width_at_border);
        double tagy01 = (bity + 0.5) / (family->width_at_border);

        // scale to [-1, 1]
        double tagx = 2*(tagx01-0.5);
        double tagy = 2*(tagy01-0.5);

        double px, py;
        homography_project(quad->H, tagx, tagy, &px, &py);

        double v = value_for_pixel(im, px, py);

        if (v == -1) {
            continue;
        }

        double thresh = (graymodel_interpolate(&blackmodel, tagx, tagy) + graymodel_interpolate(&whitemodel, tagx, tagy)) / 2.0;
        values[family->total_width*(bity - min_coord) + bitx - min_coord] = v - thresh;

        if (im_samples) {
            int ix = px;
            int iy = py;
            im_samples->buf[iy*im_samples->stride + ix] = (v < thresh) * 255;
        }
    }

    sharpen(td, values, family->total_width);

    uint64_t rcode = 0;
    for (int i = 0; i < family->nbits; i++) {
        int bity = family->bit_y[i];
        int bitx = family->bit_x[i];
        rcode = (rcode << 1);
        double v = values[(bity - min_coord)*family->total_width + bitx - min_coord];

        if (v > 0) {
            white_score += v;
            white_score_count++;
            rcode |= 1;
        } else {
            black_score -= v;
            black_score_count++;
        }
    }

    quick_decode_codeword(family, rcode, entry);
    return fmin(white_score / white_score_count, black_score / black_score_count);
}